

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

TValue * trace_state(lua_State *L,lua_CFunction dummy,void *ud)

{
  undefined8 uVar1;
  undefined8 uVar2;
  TValue *pTVar3;
  int iVar4;
  ptrdiff_t argbase_00;
  int local_134;
  TValue savetv2;
  TValue savetv;
  ptrdiff_t argbase;
  jit_State *J;
  void *ud_local;
  lua_CFunction dummy_local;
  lua_State *L_local;
  
LAB_001891e0:
  do {
    switch(*(undefined4 *)((long)ud + 0xec)) {
    case 0x12:
switchD_00189217_caseD_12:
      *(undefined4 *)((long)ud + 0xec) = 0x11;
    case 0x11:
      if (*(long *)((long)ud + 0xbd8) != 0) {
        if (*(char *)((long)ud + 0xb7) == '\0') {
          **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
          *(undefined8 *)((long)ud + 0xbd8) = 0;
        }
        else {
          *(undefined1 *)((long)ud + 0xb7) = 0;
        }
      }
      *(undefined4 *)((long)ud + -0x228) = 0xfffffffb;
      if (((*(byte *)((L->glref).ptr64 + 0x93) & 4) != 0) &&
         (argbase_00 = lj_vmevent_prepare(L,LJ_VMEVENT_RECORD), argbase_00 != 0)) {
        uVar1 = *(undefined8 *)((long)ud + -0x1f8);
        uVar2 = *(undefined8 *)((long)ud + -0x1f0);
        pTVar3 = L->top;
        L->top = pTVar3 + 1;
        pTVar3->n = (double)*(ushort *)((long)ud + 0x68);
        pTVar3 = L->top;
        L->top = pTVar3 + 1;
        pTVar3->u64 = *(ulong *)((long)ud + 0x90) | 0xfffb800000000000;
        pTVar3 = L->top;
        L->top = pTVar3 + 1;
        if (*(long *)((long)ud + 0x98) == 0) {
          local_134 = -1;
        }
        else {
          local_134 = (int)(*(long *)((long)ud + 0x88) - (*(long *)((long)ud + 0x98) + 0x68) >> 2);
        }
        pTVar3->n = (double)local_134;
        pTVar3 = L->top;
        L->top = pTVar3 + 1;
        pTVar3->n = (double)*(int *)((long)ud + 0xfc);
        lj_vmevent_call(L,argbase_00);
        *(undefined8 *)((long)ud + -0x1f8) = uVar1;
        *(undefined8 *)((long)ud + -0x1f0) = uVar2;
      }
      lj_record_ins((jit_State *)ud);
      break;
    case 0x13:
      *(undefined4 *)((long)ud + 0xec) = 0x11;
      trace_start((jit_State *)ud);
      lj_dispatch_update((global_State *)((long)ud + -0x2e0));
      if (*(int *)((long)ud + 0xec) == 0x12) goto switchD_00189217_caseD_12;
      break;
    case 0x14:
      if (*(long *)((long)ud + 0xbd8) != 0) {
        **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
        *(undefined8 *)((long)ud + 0xbd8) = 0;
      }
      *(undefined4 *)((long)ud + 0x158) = 0;
      if ((((*(uint *)((long)ud + 0xa8) & 0x400000) != 0) &&
          (*(short *)((long)ud + 0x6a) == *(short *)((long)ud + 0x68))) &&
         (*(int *)((long)ud + 0xfc) + *(int *)((long)ud + 0x100) == 0)) {
        *(undefined4 *)((long)ud + -0x228) = 0xfffffffa;
        lj_opt_dce((jit_State *)ud);
        iVar4 = lj_opt_loop((jit_State *)ud);
        if (iVar4 != 0) {
          *(undefined2 *)((long)ud + 0x6a) = 0;
          *(undefined1 *)((long)ud + 0x74) = 0;
          *(undefined4 *)((long)ud + 0x158) = *(undefined4 *)((long)ud + 0xc);
          *(undefined4 *)((long)ud + 0xec) = 0x11;
          break;
        }
        *(uint *)((long)ud + 0x158) = (uint)*(ushort *)((long)ud + 0x1b4);
      }
      lj_opt_sink((jit_State *)ud);
      if (*(int *)((long)ud + 0x158) == 0) {
        *(undefined1 *)
         (*(long *)((long)ud + 0x30) + (long)(int)(*(ushort *)((long)ud + 10) - 1) * 0xc + 0xb) =
             0xff;
      }
      *(undefined4 *)((long)ud + 0xec) = 0x15;
      break;
    case 0x15:
      *(undefined4 *)((long)ud + -0x228) = 0xfffffff9;
      lj_asm_trace((jit_State *)ud,(GCtrace *)ud);
      trace_stop((jit_State *)ud);
      *(undefined4 *)((long)ud + -0x228) = 0xffffffff;
      *(undefined4 *)((long)ud + 0xec) = 0;
      lj_dispatch_update((global_State *)((long)ud + -0x2e0));
      return (TValue *)0x0;
    case 0x16:
      goto switchD_00189217_caseD_16;
    default:
      pTVar3 = L->top;
      L->top = pTVar3 + 1;
      pTVar3->u64 = 0;
      goto switchD_00189217_caseD_16;
    }
    if (*(uint *)((long)ud + 0xec) < 0x12) {
      return (TValue *)0x0;
    }
  } while( true );
switchD_00189217_caseD_16:
  if (*(long *)((long)ud + 0xbd8) != 0) {
    **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
    *(undefined8 *)((long)ud + 0xbd8) = 0;
  }
  iVar4 = trace_abort((jit_State *)ud);
  if (iVar4 == 0) {
    *(undefined4 *)((long)ud + -0x228) = 0xffffffff;
    *(undefined4 *)((long)ud + 0xec) = 0;
    lj_dispatch_update((global_State *)((long)ud + -0x2e0));
    return (TValue *)0x0;
  }
  goto LAB_001891e0;
}

Assistant:

static TValue *trace_state(lua_State *L, lua_CFunction dummy, void *ud)
{
  jit_State *J = (jit_State *)ud;
  UNUSED(dummy);
  do {
  retry:
    switch (J->state) {
    case LJ_TRACE_START:
      J->state = LJ_TRACE_RECORD;  /* trace_start() may change state. */
      trace_start(J);
      lj_dispatch_update(J2G(J));
      if (J->state != LJ_TRACE_RECORD_1ST)
	break;
      /* fallthrough */

    case LJ_TRACE_RECORD_1ST:
      J->state = LJ_TRACE_RECORD;
      /* fallthrough */
    case LJ_TRACE_RECORD:
      trace_pendpatch(J, 0);
      setvmstate(J2G(J), RECORD);
      lj_vmevent_send_(L, RECORD,
	/* Save/restore tmptv state for trace recorder. */
	TValue savetv = J2G(J)->tmptv;
	TValue savetv2 = J2G(J)->tmptv2;
	setintV(L->top++, J->cur.traceno);
	setfuncV(L, L->top++, J->fn);
	setintV(L->top++, J->pt ? (int32_t)proto_bcpos(J->pt, J->pc) : -1);
	setintV(L->top++, J->framedepth);
      ,
	J2G(J)->tmptv = savetv;
	J2G(J)->tmptv2 = savetv2;
      );
      lj_record_ins(J);
      break;

    case LJ_TRACE_END:
      trace_pendpatch(J, 1);
      J->loopref = 0;
      if ((J->flags & JIT_F_OPT_LOOP) &&
	  J->cur.link == J->cur.traceno && J->framedepth + J->retdepth == 0) {
	setvmstate(J2G(J), OPT);
	lj_opt_dce(J);
	if (lj_opt_loop(J)) {  /* Loop optimization failed? */
	  J->cur.link = 0;
	  J->cur.linktype = LJ_TRLINK_NONE;
	  J->loopref = J->cur.nins;
	  J->state = LJ_TRACE_RECORD;  /* Try to continue recording. */
	  break;
	}
	J->loopref = J->chain[IR_LOOP];  /* Needed by assembler. */
      }
      lj_opt_split(J);
      lj_opt_sink(J);
      if (!J->loopref) J->cur.snap[J->cur.nsnap-1].count = SNAPCOUNT_DONE;
      J->state = LJ_TRACE_ASM;
      break;

    case LJ_TRACE_ASM:
      setvmstate(J2G(J), ASM);
      lj_asm_trace(J, &J->cur);
      trace_stop(J);
      setvmstate(J2G(J), INTERP);
      J->state = LJ_TRACE_IDLE;
      lj_dispatch_update(J2G(J));
      return NULL;

    default:  /* Trace aborted asynchronously. */
      setintV(L->top++, (int32_t)LJ_TRERR_RECERR);
      /* fallthrough */
    case LJ_TRACE_ERR:
      trace_pendpatch(J, 1);
      if (trace_abort(J))
	goto retry;
      setvmstate(J2G(J), INTERP);
      J->state = LJ_TRACE_IDLE;
      lj_dispatch_update(J2G(J));
      return NULL;
    }
  } while (J->state > LJ_TRACE_RECORD);
  return NULL;
}